

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

int __thiscall QPDFNumberTreeObjectHelper::remove(QPDFNumberTreeObjectHelper *this,char *__filename)

{
  NNTreeImpl *this_00;
  int iVar1;
  longlong unaff_RBX;
  char acStackY_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFNumberTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFObjectHandle::newInteger(unaff_RBX);
  iVar1 = NNTreeImpl::remove(this_00,acStackY_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return iVar1;
}

Assistant:

bool
QPDFNumberTreeObjectHelper::remove(numtree_number key, QPDFObjectHandle* value)
{
    return m->impl->remove(QPDFObjectHandle::newInteger(key), value);
}